

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O3

void ec2NegLD(word *b,word *a,ec_o *ec,void *stack)

{
  qr_o *pqVar1;
  size_t sVar2;
  
  pqVar1 = ec->f;
  sVar2 = pqVar1->n;
  (*pqVar1->mul)((word *)stack,a,a + sVar2 * 2,pqVar1,(void *)((long)stack + sVar2 * 8));
  wwCopy(b,a,sVar2 * 3);
  wwXor2(b + sVar2,(word *)stack,ec->f->n);
  return;
}

Assistant:

static void ec2NegLD(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	stack = t1 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ec2SeemsOn3(a, ec));
	ASSERT(wwIsSameOrDisjoint(a, b, 3 * n));
	// t1 <- xa * za
	qrMul(t1, ecX(a), ecZ(a, n), ec->f, stack);
	// b <- (xa, ya + t1, za)
	wwCopy(b, a, 3 * n);
	gf2Add2(ecY(b, n), t1, ec->f);
}